

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

int __thiscall jbcoin::STObject::getFieldIndex(STObject *this,SField *field)

{
  bool bVar1;
  reference this_00;
  STBase *this_01;
  SField *this_02;
  STVar *elem;
  const_iterator __end1;
  const_iterator __begin1;
  list_type *__range1;
  int i;
  SField *field_local;
  STObject *this_local;
  
  if (this->mType == (SOTemplate *)0x0) {
    __range1._4_4_ = 0;
    __end1 = std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::begin
                       (&this->v_);
    elem = (STVar *)std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::end
                              (&this->v_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
                                       *)&elem), bVar1) {
      this_00 = __gnu_cxx::
                __normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
                ::operator*(&__end1);
      this_01 = jbcoin::detail::STVar::operator->(this_00);
      this_02 = STBase::getFName(this_01);
      bVar1 = SField::operator==(this_02,field);
      if (bVar1) {
        return __range1._4_4_;
      }
      __range1._4_4_ = __range1._4_4_ + 1;
      __gnu_cxx::
      __normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
      ::operator++(&__end1);
    }
    this_local._4_4_ = -1;
  }
  else {
    this_local._4_4_ = SOTemplate::getIndex(this->mType,field);
  }
  return this_local._4_4_;
}

Assistant:

int STObject::getFieldIndex (SField const& field) const
{
    if (mType != nullptr)
        return mType->getIndex (field);

    int i = 0;
    for (auto const& elem : v_)
    {
        if (elem->getFName () == field)
            return i;
        ++i;
    }
    return -1;
}